

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void TestCipher(EVP_CIPHER *cipher,Operation input_op,bool padding,Span<const_unsigned_char> key,
               Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
               Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
               Span<const_unsigned_char> tag)

{
  Operation op;
  Span<const_unsigned_char> key_00;
  Span<const_unsigned_char> key_01;
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  Operation *pOVar5;
  undefined4 extraout_var;
  AssertHelperData *pAVar6;
  AssertHelperData *pAVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar11;
  uchar *puVar12;
  pointer pcVar13;
  byte bVar14;
  AssertHelperData *pAVar15;
  bool in_place;
  ScopedTrace gtest_trace_403;
  ScopedTrace gtest_trace_397;
  ScopedTrace gtest_trace_392;
  ScopedTrace gtest_trace_405;
  uint8_t ecount_buf [16];
  bool copy;
  AssertionResult gtest_ar_5;
  size_t chunk_size;
  uint num;
  int num_1;
  vector<Operation,_std::allocator<Operation>_> ops;
  AES_KEY aes;
  bool local_27c;
  ScopedTrace local_27b;
  ScopedTrace local_27a;
  ScopedTrace local_279;
  AssertHelper local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  AssertHelper local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  undefined1 local_258 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_250;
  pointer local_248;
  AssertHelperData *local_240;
  undefined1 local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  uchar *local_220;
  AssertHelperData *local_218;
  char local_20a [2];
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  AssertHelperData *local_200;
  Bytes local_1f8;
  AssertHelperData *local_1e8;
  uint local_1dc;
  int local_1d8;
  uint local_1d4;
  uchar *local_1d0;
  AssertHelperData *local_1c8;
  uint local_1c0;
  Operation local_1bc;
  Bytes local_1b8;
  Operation *local_1a8;
  Operation *pOStack_1a0;
  long local_198;
  AssertHelperData *local_188;
  Operation *local_180;
  Operation *local_178;
  long local_170;
  uchar *local_168;
  size_t local_160;
  long local_158;
  ulong local_150;
  uchar *local_148;
  size_t sStack_140;
  uchar *local_138;
  size_t sStack_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  
  local_1d0 = key.data_;
  uVar3 = EVP_CIPHER_block_size((EVP_CIPHER *)cipher);
  local_1a8 = (Operation *)0x0;
  pOStack_1a0 = (Operation *)0x0;
  local_198 = 0;
  if (input_op == kBoth) {
    local_128._0_4_ = 1;
    local_128._4_4_ = 2;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&local_1a8,local_128);
  }
  else {
    local_128._0_4_ = input_op;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&local_1a8,local_128);
  }
  local_180 = pOStack_1a0;
  if (local_1a8 != pOStack_1a0) {
    local_150 = (ulong)uVar3;
    local_1d8 = (int)key.size_ * 8;
    pOVar5 = local_1a8;
    local_160 = key.size_;
    do {
      op = *pOVar5;
      local_178 = pOVar5;
      if (3 < (ulong)op) {
LAB_002491d2:
        abort();
      }
      testing::ScopedTrace::ScopedTrace
                (&local_279,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x188,&DAT_00545d50 + *(int *)(&DAT_00545d50 + (ulong)op * 4));
      local_1dc = (uint)(op == kEncrypt);
      lVar8 = 0;
      do {
        local_1e8 = *(AssertHelperData **)((long)TestCipher::kChunkSizes + lVar8);
        local_170 = lVar8;
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_27a,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x18d,(unsigned_long *)&local_1e8);
        if (((local_1e8 <= plaintext.size_) || (local_1e8 <= ciphertext.size_)) ||
           (local_1e8 <= aad.size_)) {
          local_20a[0] = '\0';
          local_20a[1] = '\x01';
          lVar8 = 0;
          do {
            local_158 = lVar8;
            local_27c = (bool)local_20a[lVar8];
            testing::ScopedTrace::ScopedTrace<bool>
                      (&local_27b,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x193,&local_27c);
            sVar2 = local_160;
            local_128._0_2_ = 0x100;
            lVar8 = 0;
            do {
              local_258[0] = (internal)local_128[lVar8];
              testing::ScopedTrace::ScopedTrace<bool>
                        ((ScopedTrace *)&local_278,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x195,(bool *)local_258);
              local_138 = local_1d0;
              sStack_130 = sVar2;
              key_00.size_ = sVar2;
              key_00.data_ = local_1d0;
              TestCipherAPI(cipher,op,padding,(bool)local_258[0],local_27c,false,(size_t)local_1e8,
                            key_00,iv,plaintext,ciphertext,aad,tag);
              if ((!padding) && ((ulong)local_1e8 % local_150 == 0)) {
                local_148 = local_1d0;
                sStack_140 = sVar2;
                key_01.size_ = sVar2;
                key_01.data_ = local_1d0;
                TestCipherAPI(cipher,op,false,(bool)local_258[0],local_27c,true,(size_t)local_1e8,
                              key_01,iv,plaintext,ciphertext,aad,tag);
              }
              testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_278);
              bVar1 = local_27c;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 2);
            if (!padding) {
              local_218 = local_1e8;
              local_168 = iv.data_;
              local_188 = (AssertHelperData *)iv.size_;
              pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       plaintext.size_;
              local_240 = (AssertHelperData *)ciphertext.size_;
              local_220 = ciphertext.data_;
              local_1c8 = (AssertHelperData *)plaintext.data_;
              if (op == kEncrypt) {
                pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ciphertext.size_;
                local_240 = (AssertHelperData *)plaintext.size_;
                local_220 = plaintext.data_;
                local_1c8 = (AssertHelperData *)ciphertext.data_;
              }
              local_1bc = op;
              iVar4 = EVP_CIPHER_nid((EVP_CIPHER *)cipher);
              bVar14 = (byte)(0x111 >> ((byte)(iVar4 - 0x1a4U) & 0x1f)) & iVar4 - 0x1a4U < 9;
              if (((iVar4 - 0x388U < 3) ||
                  ((iVar4 - 0x1a3U < 9 && ((0x111U >> (iVar4 - 0x1a3U & 0x1f) & 1) != 0)))) ||
                 (bVar14 != 0)) {
                local_258._0_4_ = 3;
                local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar4);
                local_1c0 = iVar4 - 0x388U;
                testing::internal::CmpHelperNE<Operation,Operation>
                          ((internal *)local_128,"op","Operation::kInvalidDecrypt",&local_1bc,
                           (Operation *)local_258);
                if (local_128[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_258);
                  pcVar13 = "";
                  if (local_120 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar13 = (local_120->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_278,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x134,pcVar13);
                  testing::internal::AssertHelper::operator=(&local_278,(Message *)local_258);
                  testing::internal::AssertHelper::~AssertHelper(&local_278);
                  if (local_258 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_258 + 8))();
                  }
                  if (local_120 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  goto LAB_00248c6e;
                  pdVar11 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_120;
                  pbVar9 = local_120;
                }
                else {
                  if (local_120 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_120,local_120);
                  }
                  if (((op == kEncrypt) || (uVar3 = (int)local_228 - 0x1a3, 8 < uVar3)) ||
                     ((0x111U >> (uVar3 & 0x1f) & 1) == 0)) {
                    local_278.data_._0_4_ = 0;
                    iVar4 = AES_set_encrypt_key(local_1d0,local_1d8,(AES_KEY *)local_128);
                    local_268.data_._0_4_ = iVar4;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_258,"0",
                               "AES_set_encrypt_key(key.data(), key.size() * 8, &aes)",
                               (int *)&local_278,(int *)&local_268);
                    if (local_258[0] != (internal)0x0) goto LAB_002488b3;
                    testing::Message::Message((Message *)&local_278);
                    pcVar13 = "";
                    if (pbStack_250 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar13 = (pbStack_250->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_268,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x138,pcVar13);
                    testing::internal::AssertHelper::operator=(&local_268,(Message *)&local_278);
                  }
                  else {
                    local_278.data_._0_4_ = 0;
                    iVar4 = AES_set_decrypt_key(local_1d0,local_1d8,(AES_KEY *)local_128);
                    local_268.data_._0_4_ = iVar4;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_258,"0",
                               "AES_set_decrypt_key(key.data(), key.size() * 8, &aes)",
                               (int *)&local_278,(int *)&local_268);
                    if (local_258[0] != (internal)0x0) {
LAB_002488b3:
                      if (pbStack_250 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&pbStack_250,pbStack_250);
                      }
                      pAVar7 = local_240;
                      local_258 = (undefined1  [8])0x0;
                      pbStack_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                      local_248 = (pointer)0x0;
                      if (bVar1 == false) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_258,(size_type)pbVar9);
                        local_268.data_ = local_240;
                      }
                      else {
                        std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        _M_assign_aux<unsigned_char_const*>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,
                                   local_220,local_220 + (long)local_240);
                        local_268.data_ = pAVar7;
                      }
                      local_208.
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              )local_258;
                      local_238 = (undefined1  [8])((long)pbStack_250 - (long)local_258);
                      local_200 = (AssertHelperData *)local_238;
                      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                ((internal *)&local_278,"in.size()","out.size()",
                                 (unsigned_long *)&local_268,(unsigned_long *)local_238);
                      if (local_278.data_._0_1_ == (ScopedTrace)0x0) {
                        testing::Message::Message((Message *)&local_268);
                        pcVar13 = "";
                        if (local_270 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar13 = (local_270->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_238,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                   ,0x145,pcVar13);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_238,(Message *)&local_268);
LAB_00248c22:
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
                        if (local_268.data_ != (AssertHelperData *)0x0) {
                          (**(code **)(*(long *)local_268.data_ + 8))();
                        }
                        if (local_270 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pdVar11 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_270;
                          pbVar9 = local_270;
LAB_00248c4c:
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()(pdVar11,pbVar9);
                        }
                      }
                      else {
                        if (local_270 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_270,local_270);
                        }
                        local_268.data_ = local_188;
                        local_238 = (undefined1  [8])&DAT_00000010;
                        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                  ((internal *)&local_278,"iv.size()","size_t{16}",
                                   (unsigned_long *)&local_268,(unsigned_long *)local_238);
                        if (local_278.data_._0_1_ == (ScopedTrace)0x0) {
                          testing::Message::Message((Message *)&local_268);
                          pcVar13 = "";
                          if (local_270 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar13 = (local_270->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_238,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                     ,0x148,pcVar13);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_238,(Message *)&local_268);
                          goto LAB_00248c22;
                        }
                        if (local_270 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_270,local_270);
                        }
                        if (local_188 != (AssertHelperData *)0x0) {
                          memcpy(&local_278,local_168,(size_t)local_188);
                        }
                        if (local_1c0 < 3) {
                          local_1d4 = 0;
                          pAVar7 = local_240;
                          _Var10.
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )local_208;
                          puVar12 = local_220;
                          local_228 = pbVar9;
                          if (local_218 == (AssertHelperData *)0x0) {
                            AES_ctr128_encrypt(local_220,
                                               (uchar *)local_208.
                                                                                                                
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_240,
                                               (AES_KEY *)local_128,(uchar *)&local_278,
                                               (uchar *)&local_268,&local_1d4);
                          }
                          else {
                            do {
                              pAVar15 = local_218;
                              if (pAVar7 < local_218) {
                                pAVar15 = pAVar7;
                              }
                              local_240 = pAVar7;
                              AES_ctr128_encrypt(puVar12,(uchar *)_Var10.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar15,(AES_KEY *)local_128
                                                 ,(uchar *)&local_278,(uchar *)&local_268,&local_1d4
                                                );
                              pAVar6 = (AssertHelperData *)((long)local_200 - (long)pAVar15);
                              if (local_200 < pAVar15) goto LAB_002491d2;
                              pAVar7 = (AssertHelperData *)((long)local_240 - (long)pAVar15);
                              _Var10.
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&pAVar15->type +
                                        (long)&((AssertHelperData *)
                                               _Var10.
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl)->type);
                              puVar12 = puVar12 + (long)pAVar15;
                              local_200 = pAVar6;
                            } while ((AssertHelperData *)((long)local_240 - (long)pAVar15) !=
                                     (AssertHelperData *)0x0);
                          }
                          local_1f8.span_.data_ = (uchar *)local_1c8;
                          local_1f8.span_.size_ = (size_t)local_228;
                          local_1b8.span_.size_ = (long)pbStack_250 - (long)local_258;
                          local_1b8.span_.data_ = (uchar *)local_258;
                          testing::internal::CmpHelperEQ<Bytes,Bytes>
                                    ((internal *)local_238,"Bytes(expected)","Bytes(result)",
                                     &local_1f8,&local_1b8);
                          if (local_238[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_1f8);
                            pcVar13 = "";
                            if (local_230 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar13 = (local_230->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_1b8,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                       ,0x15b,pcVar13);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_1b8,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&local_1b8);
                            if ((AssertHelperData *)local_1f8.span_.data_ != (AssertHelperData *)0x0
                               ) {
                              (**(code **)(*(long *)local_1f8.span_.data_ + 8))();
                            }
                          }
                          if (local_230 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) goto LAB_00248c51;
                          pdVar11 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_230;
                          pbVar9 = local_230;
                          goto LAB_00248c4c;
                        }
                        uVar3 = (int)local_228 - 0x1a3;
                        if (((uVar3 < 9) && ((0x111U >> (uVar3 & 0x1f) & 1) != 0)) &&
                           (((ulong)local_218 & 0xf) == 0)) {
                          pAVar7 = local_240;
                          _Var10.
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )local_208;
                          puVar12 = local_220;
                          local_228 = pbVar9;
                          if (local_218 == (AssertHelperData *)0x0) {
                            AES_cbc_encrypt(local_220,
                                            (uchar *)local_208.
                                                                                                          
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_240,
                                            (AES_KEY *)local_128,(uchar *)&local_278,local_1dc);
                          }
                          else {
                            do {
                              pAVar15 = local_218;
                              if (pAVar7 < local_218) {
                                pAVar15 = pAVar7;
                              }
                              local_240 = pAVar7;
                              AES_cbc_encrypt(puVar12,(uchar *)_Var10.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar15,(AES_KEY *)local_128
                                              ,(uchar *)&local_278,local_1dc);
                              pAVar6 = (AssertHelperData *)((long)local_200 - (long)pAVar15);
                              if (local_200 < pAVar15) goto LAB_002491d2;
                              pAVar7 = (AssertHelperData *)((long)local_240 - (long)pAVar15);
                              _Var10.
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&pAVar15->type +
                                        (long)&((AssertHelperData *)
                                               _Var10.
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl)->type);
                              puVar12 = puVar12 + (long)pAVar15;
                              local_200 = pAVar6;
                            } while ((AssertHelperData *)((long)local_240 - (long)pAVar15) !=
                                     (AssertHelperData *)0x0);
                          }
                          local_238 = (undefined1  [8])local_1c8;
                          local_230 = local_228;
                          local_1f8.span_.size_ = (long)pbStack_250 - (long)local_258;
                          local_1f8.span_.data_ = (uchar *)local_258;
                          testing::internal::CmpHelperEQ<Bytes,Bytes>
                                    ((internal *)&local_268,"Bytes(expected)","Bytes(result)",
                                     (Bytes *)local_238,&local_1f8);
                          if (local_268.data_._0_1_ == (internal)0x0) {
                            testing::Message::Message((Message *)local_238);
                            pcVar13 = "";
                            if (local_260 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar13 = (local_260->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_1f8,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                       ,0x168,pcVar13);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_1f8,(Message *)local_238);
LAB_00249146:
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&local_1f8);
                            if (local_238 != (undefined1  [8])0x0) {
                              (**(code **)(*(long *)local_238 + 8))();
                            }
                          }
                        }
                        else {
                          if (bVar14 == 0) goto LAB_00248c51;
                          local_1b8.span_.data_ =
                               (uchar *)((ulong)local_1b8.span_.data_ & 0xffffffff00000000);
                          pAVar7 = local_240;
                          _Var10.
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )local_208;
                          puVar12 = local_220;
                          local_228 = pbVar9;
                          if (local_218 == (AssertHelperData *)0x0) {
                            AES_ofb128_encrypt(local_220,
                                               (uchar *)local_208.
                                                                                                                
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_240,
                                               (AES_KEY *)local_128,(uchar *)&local_278,
                                               (int *)&local_1b8);
                          }
                          else {
                            do {
                              pAVar15 = local_218;
                              if (pAVar7 < local_218) {
                                pAVar15 = pAVar7;
                              }
                              local_240 = pAVar7;
                              AES_ofb128_encrypt(puVar12,(uchar *)_Var10.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar15,(AES_KEY *)local_128
                                                 ,(uchar *)&local_278,(int *)&local_1b8);
                              pAVar6 = (AssertHelperData *)((long)local_200 - (long)pAVar15);
                              if (local_200 < pAVar15) goto LAB_002491d2;
                              pAVar7 = (AssertHelperData *)((long)local_240 - (long)pAVar15);
                              _Var10.
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&pAVar15->type +
                                        (long)&((AssertHelperData *)
                                               _Var10.
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl)->type);
                              puVar12 = puVar12 + (long)pAVar15;
                              local_200 = pAVar6;
                            } while ((AssertHelperData *)((long)local_240 - (long)pAVar15) !=
                                     (AssertHelperData *)0x0);
                          }
                          local_238 = (undefined1  [8])local_1c8;
                          local_230 = local_228;
                          local_1f8.span_.size_ = (long)pbStack_250 - (long)local_258;
                          local_1f8.span_.data_ = (uchar *)local_258;
                          testing::internal::CmpHelperEQ<Bytes,Bytes>
                                    ((internal *)&local_268,"Bytes(expected)","Bytes(result)",
                                     (Bytes *)local_238,&local_1f8);
                          if (local_268.data_._0_1_ == (internal)0x0) {
                            testing::Message::Message((Message *)local_238);
                            pcVar13 = "";
                            if (local_260 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar13 = (local_260->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_1f8,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                       ,0x175,pcVar13);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_1f8,(Message *)local_238);
                            goto LAB_00249146;
                          }
                        }
                        if (local_260 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pdVar11 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_260;
                          pbVar9 = local_260;
                          goto LAB_00248c4c;
                        }
                      }
LAB_00248c51:
                      if (local_258 != (undefined1  [8])0x0) {
                        operator_delete((void *)local_258,(long)local_248 - (long)local_258);
                      }
                      goto LAB_00248c6e;
                    }
                    testing::Message::Message((Message *)&local_278);
                    pcVar13 = "";
                    if (pbStack_250 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar13 = (pbStack_250->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_268,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x13a,pcVar13);
                    testing::internal::AssertHelper::operator=(&local_268,(Message *)&local_278);
                  }
                  testing::internal::AssertHelper::~AssertHelper(&local_268);
                  if ((long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_) != (long *)0x0)
                  {
                    (**(code **)(*(long *)CONCAT44(local_278.data_._4_4_,local_278.data_._0_4_) + 8)
                    )();
                  }
                  if (pbStack_250 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  goto LAB_00248c6e;
                  pdVar11 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&pbStack_250;
                  pbVar9 = pbStack_250;
                }
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(pdVar11,pbVar9);
              }
            }
LAB_00248c6e:
            testing::ScopedTrace::~ScopedTrace(&local_27b);
            lVar8 = local_158 + 1;
          } while (lVar8 != 2);
        }
        testing::ScopedTrace::~ScopedTrace(&local_27a);
        lVar8 = local_170 + 8;
      } while (lVar8 != 0x88);
      testing::ScopedTrace::~ScopedTrace(&local_279);
      pOVar5 = local_178 + 1;
    } while (pOVar5 != local_180);
  }
  if (local_1a8 != (Operation *)0x0) {
    operator_delete(local_1a8,local_198 - (long)local_1a8);
  }
  return;
}

Assistant:

static void TestCipher(const EVP_CIPHER *cipher, Operation input_op,
                       bool padding, bssl::Span<const uint8_t> key,
                       bssl::Span<const uint8_t> iv,
                       bssl::Span<const uint8_t> plaintext,
                       bssl::Span<const uint8_t> ciphertext,
                       bssl::Span<const uint8_t> aad,
                       bssl::Span<const uint8_t> tag) {
  size_t block_size = EVP_CIPHER_block_size(cipher);
  std::vector<Operation> ops;
  if (input_op == Operation::kBoth) {
    ops = {Operation::kEncrypt, Operation::kDecrypt};
  } else {
    ops = {input_op};
  }
  for (Operation op : ops) {
    SCOPED_TRACE(OperationToString(op));
    // Zero indicates a single-shot API.
    static const size_t kChunkSizes[] = {0,  1,  2,  5,  7,  8,  9,  15, 16,
                                         17, 31, 32, 33, 63, 64, 65, 512};
    for (size_t chunk_size : kChunkSizes) {
      SCOPED_TRACE(chunk_size);
      if (chunk_size > plaintext.size() && chunk_size > ciphertext.size() &&
          chunk_size > aad.size()) {
        continue;
      }
      for (bool in_place : {false, true}) {
        SCOPED_TRACE(in_place);
        for (bool copy : {false, true}) {
          SCOPED_TRACE(copy);
          TestCipherAPI(cipher, op, padding, copy, in_place,
                        /*use_evp_cipher=*/false, chunk_size, key, iv,
                        plaintext, ciphertext, aad, tag);
          if (!padding && chunk_size % block_size == 0) {
            TestCipherAPI(cipher, op, padding, copy, in_place,
                          /*use_evp_cipher=*/true, chunk_size, key, iv,
                          plaintext, ciphertext, aad, tag);
          }
        }
        if (!padding) {
          TestLowLevelAPI(cipher, op, in_place, chunk_size, key, iv, plaintext,
                          ciphertext);
        }
      }
    }
  }
}